

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int ref_match_found_in_nb_blocks(MB_MODE_INFO *cur_mbmi,MB_MODE_INFO *nb_mbmi)

{
  int iVar1;
  long in_RSI;
  MB_MODE_INFO *in_RDI;
  int i;
  int match_found;
  int is_cur_comp_pred;
  MV_REFERENCE_FRAME cur_ref_frames [2];
  MV_REFERENCE_FRAME nb_ref_frames [2];
  int local_20;
  int local_1c;
  MV_REFERENCE_FRAME local_14 [2];
  char local_12;
  char local_11;
  
  local_12 = *(char *)(in_RSI + 0x10);
  local_11 = *(char *)(in_RSI + 0x11);
  local_14[0] = in_RDI->ref_frame[0];
  local_14[1] = in_RDI->ref_frame[1];
  iVar1 = has_second_ref(in_RDI);
  local_1c = 0;
  for (local_20 = 0; local_20 < iVar1 + 1; local_20 = local_20 + 1) {
    if ((local_14[local_20] == local_12) || (local_14[local_20] == local_11)) {
      local_1c = 1;
    }
  }
  return local_1c;
}

Assistant:

static inline int ref_match_found_in_nb_blocks(MB_MODE_INFO *cur_mbmi,
                                               MB_MODE_INFO *nb_mbmi) {
  MV_REFERENCE_FRAME nb_ref_frames[2] = { nb_mbmi->ref_frame[0],
                                          nb_mbmi->ref_frame[1] };
  MV_REFERENCE_FRAME cur_ref_frames[2] = { cur_mbmi->ref_frame[0],
                                           cur_mbmi->ref_frame[1] };
  const int is_cur_comp_pred = has_second_ref(cur_mbmi);
  int match_found = 0;

  for (int i = 0; i < (is_cur_comp_pred + 1); i++) {
    if ((cur_ref_frames[i] == nb_ref_frames[0]) ||
        (cur_ref_frames[i] == nb_ref_frames[1]))
      match_found = 1;
  }
  return match_found;
}